

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Session SStack_198;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"macros defined:\n",0x10)
  ;
  Catch::Session::Session(&SStack_198);
  iVar1 = Catch::Session::run<char>(&SStack_198,argc,argv);
  Catch::Session::~Session(&SStack_198);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    std::cout << "macros defined:\n";
#ifdef _WIN32
    std::cout << "_WIN32 defined\n";
#endif

#ifdef __CYGWIN__
    std::cout << "__CYGWIN__ defined\n";
#endif

#ifdef __APPLE__
    std::cout << "__APPLE__ defined\n";
#endif

    // your existing setup...
    int result = Catch::Session().run(argc, argv);

    // your existing clean-up...
    return result;
}